

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_enc.c
# Opt level: O0

void VP8IteratorExport(VP8EncIterator *it)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int dst_stride;
  int w_00;
  uint8_t *src;
  int *in_RDI;
  int uv_h;
  int uv_w;
  int h;
  int w;
  uint8_t *vdst;
  uint8_t *udst;
  uint8_t *ydst;
  WebPPicture *pic;
  uint8_t *vsrc;
  uint8_t *usrc;
  uint8_t *ysrc;
  int y;
  int x;
  VP8Encoder *enc;
  int in_stack_ffffffffffffff9c;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  
  if (*(int *)(**(long **)(in_RDI + 10) + 0x40) != 0) {
    lVar1 = (*(long **)(in_RDI + 10))[1];
    src = (uint8_t *)
          (*(long *)(lVar1 + 0x20) + (long)((in_RDI[1] * *(int *)(lVar1 + 0x2c) + *in_RDI) * 8));
    iVar2 = *(int *)(lVar1 + 8) + *in_RDI * -0x10;
    iVar3 = *(int *)(lVar1 + 0xc) + in_RDI[1] * -0x10;
    if (0x10 < iVar2) {
      iVar2 = 0x10;
    }
    if (0x10 < iVar3) {
      iVar3 = 0x10;
    }
    ExportBlock(src,(uint8_t *)CONCAT44(iVar2,iVar3),in_stack_ffffffffffffffa4,
                in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    dst_stride = iVar2 + 1 >> 1;
    w_00 = iVar3 + 1 >> 1;
    ExportBlock(src,(uint8_t *)CONCAT44(iVar2,iVar3),dst_stride,w_00,in_stack_ffffffffffffff9c);
    ExportBlock(src,(uint8_t *)CONCAT44(iVar2,iVar3),dst_stride,w_00,in_stack_ffffffffffffff9c);
  }
  return;
}

Assistant:

void VP8IteratorExport(const VP8EncIterator* const it) {
  const VP8Encoder* const enc = it->enc_;
  if (enc->config_->show_compressed) {
    const int x = it->x_, y = it->y_;
    const uint8_t* const ysrc = it->yuv_out_ + Y_OFF_ENC;
    const uint8_t* const usrc = it->yuv_out_ + U_OFF_ENC;
    const uint8_t* const vsrc = it->yuv_out_ + V_OFF_ENC;
    const WebPPicture* const pic = enc->pic_;
    uint8_t* const ydst = pic->y + (y * pic->y_stride + x) * 16;
    uint8_t* const udst = pic->u + (y * pic->uv_stride + x) * 8;
    uint8_t* const vdst = pic->v + (y * pic->uv_stride + x) * 8;
    int w = (pic->width - x * 16);
    int h = (pic->height - y * 16);

    if (w > 16) w = 16;
    if (h > 16) h = 16;

    // Luma plane
    ExportBlock(ysrc, ydst, pic->y_stride, w, h);

    {   // U/V planes
      const int uv_w = (w + 1) >> 1;
      const int uv_h = (h + 1) >> 1;
      ExportBlock(usrc, udst, pic->uv_stride, uv_w, uv_h);
      ExportBlock(vsrc, vdst, pic->uv_stride, uv_w, uv_h);
    }
  }
}